

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::operator==
          (Entity_Damage_Status_PDU *this,Entity_Damage_Status_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Entity_Damage_Status_PDU *Value_local;
  Entity_Damage_Status_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_DmgEnt,&Value->m_DmgEnt);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui16NumDmgDescRecs == Value->m_ui16NumDmgDescRecs) {
      bVar2 = std::operator!=(&this->m_vDdRec,&Value->m_vDdRec);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Entity_Damage_Status_PDU::operator == ( const Entity_Damage_Status_PDU & Value ) const
{
    if( Header::operator     !=( Value ) )                   return false;
    if( m_DmgEnt             != Value.m_DmgEnt )             return false;
    if( m_ui16NumDmgDescRecs != Value.m_ui16NumDmgDescRecs ) return false;
    if( m_vDdRec             != Value.m_vDdRec )             return false;
    return true;
}